

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathNodeSetAddUnique(xmlNodeSetPtr cur,xmlNodePtr val)

{
  int iVar1;
  xmlNodePtr *ppxVar2;
  xmlNodePtr pxVar3;
  char *extra;
  xmlNsPtr ns;
  
  if (val == (xmlNodePtr)0x0 || cur == (xmlNodeSetPtr)0x0) {
    return -1;
  }
  iVar1 = cur->nodeMax;
  if ((long)iVar1 == 0) {
    ppxVar2 = (xmlNodePtr *)(*xmlMalloc)(0x50);
    cur->nodeTab = ppxVar2;
    if (ppxVar2 == (xmlNodePtr *)0x0) {
LAB_001cdc3f:
      extra = "growing nodeset\n";
LAB_001cdc46:
      xmlXPathErrMemory((xmlXPathContextPtr)0x0,extra);
      return -1;
    }
    ppxVar2[8] = (xmlNodePtr)0x0;
    ppxVar2[9] = (xmlNodePtr)0x0;
    ppxVar2[6] = (xmlNodePtr)0x0;
    ppxVar2[7] = (xmlNodePtr)0x0;
    ppxVar2[4] = (xmlNodePtr)0x0;
    ppxVar2[5] = (xmlNodePtr)0x0;
    ppxVar2[2] = (xmlNodePtr)0x0;
    ppxVar2[3] = (xmlNodePtr)0x0;
    *ppxVar2 = (xmlNodePtr)0x0;
    ppxVar2[1] = (xmlNodePtr)0x0;
    iVar1 = 10;
  }
  else {
    if (cur->nodeNr != iVar1) goto LAB_001cdc07;
    if (9999999 < iVar1) {
      extra = "growing nodeset hit limit\n";
      goto LAB_001cdc46;
    }
    ppxVar2 = (xmlNodePtr *)(*xmlRealloc)(cur->nodeTab,(long)iVar1 << 4);
    if (ppxVar2 == (xmlNodePtr *)0x0) goto LAB_001cdc3f;
    cur->nodeTab = ppxVar2;
    iVar1 = cur->nodeMax * 2;
  }
  cur->nodeMax = iVar1;
LAB_001cdc07:
  if (val->type == XML_NAMESPACE_DECL) {
    pxVar3 = xmlXPathNodeSetDupNs((xmlNodePtr)val->_private,(xmlNsPtr)val);
    iVar1 = cur->nodeNr;
    cur->nodeNr = iVar1 + 1;
    cur->nodeTab[iVar1] = pxVar3;
  }
  else {
    iVar1 = cur->nodeNr;
    cur->nodeNr = iVar1 + 1;
    cur->nodeTab[iVar1] = val;
  }
  return 0;
}

Assistant:

int
xmlXPathNodeSetAddUnique(xmlNodeSetPtr cur, xmlNodePtr val) {
    if ((cur == NULL) || (val == NULL)) return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeMax == 0) {
        cur->nodeTab = (xmlNodePtr *) xmlMalloc(XML_NODESET_DEFAULT *
					     sizeof(xmlNodePtr));
	if (cur->nodeTab == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	memset(cur->nodeTab, 0 ,
	       XML_NODESET_DEFAULT * sizeof(xmlNodePtr));
        cur->nodeMax = XML_NODESET_DEFAULT;
    } else if (cur->nodeNr == cur->nodeMax) {
        xmlNodePtr *temp;

        if (cur->nodeMax >= XPATH_MAX_NODESET_LENGTH) {
            xmlXPathErrMemory(NULL, "growing nodeset hit limit\n");
            return(-1);
        }
	temp = (xmlNodePtr *) xmlRealloc(cur->nodeTab, cur->nodeMax * 2 *
				      sizeof(xmlNodePtr));
	if (temp == NULL) {
	    xmlXPathErrMemory(NULL, "growing nodeset\n");
	    return(-1);
	}
	cur->nodeTab = temp;
        cur->nodeMax *= 2;
    }
    if (val->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) val;

        /* TODO: Check memory error. */
	cur->nodeTab[cur->nodeNr++] =
	    xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);
    } else
	cur->nodeTab[cur->nodeNr++] = val;
    return(0);
}